

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLTokenizer.cpp
# Opt level: O3

TokenListType * __thiscall
Diligent::Parsing::HLSLTokenizer::Tokenize
          (TokenListType *__return_storage_ptr__,HLSLTokenizer *this,String *Source)

{
  _List_node_base **pp_Var1;
  byte bVar2;
  char cVar3;
  char *pcVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  __node_base_ptr p_Var9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  undefined8 *puVar11;
  TokenType _Type;
  const_iterator cVar12;
  long lVar13;
  _List_node_base *p_Var14;
  bool bVar15;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  LiteralStart;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  DelimStart;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  LiteralEnd;
  string _msg;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  DelimEnd;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  _List_node_base *local_110;
  const_iterator local_108;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  size_t local_b0;
  _List_node_base *local_a8;
  const_iterator local_a0;
  size_t local_98;
  const_iterator local_90;
  HashMapStringKey local_88 [2];
  const_iterator local_68;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_60;
  char *local_58;
  
  pcVar4 = (Source->_M_dataplus)._M_p;
  local_100._M_current = pcVar4 + Source->_M_string_length;
  (__return_storage_ptr__->
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  )._M_impl._M_node._M_size = 0;
  local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
  local_f8._16_8_ = 0;
  local_e0._M_local_buf[0] = '\0';
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0 = 0xffffffffffffffff;
  local_110 = (_List_node_base *)__return_storage_ptr__;
  local_f8._8_8_ = &local_e0;
  local_d0._M_p = (pointer)&local_c0;
  local_60 = (_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)this;
  local_58 = pcVar4;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  _M_insert<Diligent::Parsing::HLSLTokenInfo>
            (__return_storage_ptr__,(iterator)__return_storage_ptr__,(HLSLTokenInfo *)local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p,
                    CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._8_8_ != &local_e0) {
    operator_delete((void *)local_f8._8_8_,
                    CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
  }
  if (local_100._M_current != pcVar4) {
    local_98 = 0;
    local_118._M_current = pcVar4;
    do {
      local_a0._M_current = local_118._M_current;
      _Var8 = SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (&local_118,&local_100,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
      cVar12._M_current = local_a0._M_current;
      local_90._M_current = local_a0._M_current;
      local_118 = _Var8;
      local_108._M_current = _Var8._M_current;
      local_68._M_current = _Var8._M_current;
      if (local_100._M_current == _Var8._M_current) {
        HLSLTokenInfo::Create
                  ((HLSLTokenInfo *)local_f8,Undefined,&local_a0,&local_68,&local_108,&local_118,
                   local_98);
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        _M_insert<Diligent::Parsing::HLSLTokenInfo>
                  ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                    *)local_110,(iterator)local_110,(HLSLTokenInfo *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_p != &local_c0) {
          operator_delete(local_d0._M_p,
                          CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._8_8_ == &local_e0) {
          return (TokenListType *)local_110;
        }
        operator_delete((void *)local_f8._8_8_,
                        CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1)
        ;
        return (TokenListType *)local_110;
      }
      bVar2 = *_Var8._M_current;
      if (0x5c < bVar2) {
        switch(bVar2) {
        case 0x7b:
          local_118._M_current = _Var8._M_current + 1;
          _Type = OpenBrace;
          break;
        case 0x7c:
          goto switchD_00247b5c_caseD_26;
        case 0x7d:
          local_118._M_current = _Var8._M_current + 1;
          _Type = ClosingBrace;
          break;
        case 0x7e:
switchD_00247b82_caseD_7e:
          _Type = BitwiseOp;
          local_118._M_current = _Var8._M_current + 1;
          break;
        default:
          if (bVar2 != 0x5d) {
            if (bVar2 != 0x5e) goto switchD_00247b5c_caseD_24;
            goto switchD_00247b82_caseD_7e;
          }
          _Type = ClosingSquareBracket;
          local_118._M_current = _Var8._M_current + 1;
        }
        goto LAB_00248014;
      }
      switch(bVar2) {
      case 0x21:
        local_118._M_current = _Var8._M_current + 1;
        _Type = LogicOp;
        break;
      case 0x22:
        local_108._M_current = _Var8._M_current + 1;
        local_118._M_current = local_108._M_current;
        while( true ) {
          cVar12._M_current = local_118._M_current;
          if (cVar12._M_current == local_100._M_current) goto LAB_002483ed;
          local_118._M_current = cVar12._M_current + 1;
          if (*cVar12._M_current == '\"') break;
          if (*cVar12._M_current == '\0') {
LAB_002483ed:
            local_118._M_current = cVar12._M_current;
            puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
            *puVar11 = local_108._M_current + -1;
            puVar11[1] = "Unable to find matching closing quotes.";
            __cxa_throw(puVar11,&std::
                                 pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                 ::typeinfo,0);
          }
        }
        _Type = StringConstant;
        local_90._M_current = cVar12._M_current;
        break;
      case 0x23:
        do {
          local_118._M_current = local_118._M_current + 1;
          if (local_118._M_current == local_100._M_current) goto LAB_002483bd;
          cVar3 = *local_118._M_current;
        } while ((cVar3 == ' ') || (cVar3 == '\t'));
        if ((local_118._M_current == local_100._M_current) || (cVar3 == '\0')) {
LAB_002483bd:
          puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar11 = local_108._M_current;
          puVar11[1] = "Missing preprocessor directive.";
          __cxa_throw(puVar11,&std::
                               pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               ::typeinfo,0);
        }
        if (cVar3 == '/') {
          puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar11 = local_108._M_current;
          puVar11[1] = "Comments between # and preprocessor directive are currently not supported.";
          __cxa_throw(puVar11,&std::
                               pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               ::typeinfo,0);
        }
        if (cVar3 == '\n') goto LAB_002483bd;
        local_118 = SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              (&local_118,&local_100);
        _Type = PreprocessorDirective;
        break;
      case 0x24:
      case 0x27:
      case 0x2e:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
switchD_00247b5c_caseD_24:
        local_118 = SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              (&local_118,&local_100);
        if (local_108._M_current == local_118._M_current) {
          local_118 = SkipFloatNumber<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                (&local_118,&local_100);
          if (local_108._M_current == local_118._M_current) {
            local_118._M_current = local_118._M_current + 1;
            _Type = Undefined;
          }
          else {
            _Type = NumericConstant;
          }
        }
        else {
          local_f8._0_8_ = local_f8 + 0x10;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_f8,local_108._M_current,local_118._M_current);
          HashMapStringKey::HashMapStringKey(local_88,(Char *)local_f8._0_8_,true);
          p_Var9 = std::
                   _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::_M_find_before_node
                             (local_60,(local_88[0].Ownership_Hash & 0x7fffffffffffffff) %
                                       local_60->_M_bucket_count,local_88,
                              local_88[0].Ownership_Hash & 0x7fffffffffffffff);
          if (p_Var9 == (__node_base_ptr)0x0) {
            p_Var14 = (_List_node_base *)0x0;
          }
          else {
            p_Var14 = (_List_node_base *)p_Var9->_M_nxt;
          }
          if ((local_88[0].Str != (Char *)0x0) && ((long)local_88[0].Ownership_Hash < 0)) {
            operator_delete__(local_88[0].Str);
          }
          local_88[0].Str = (Char *)0x0;
          local_88[0].Ownership_Hash = 0;
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
          }
          if (p_Var14 == (_List_node_base *)0x0) {
            _Type = Identifier;
          }
          else {
            local_f8._0_8_ = local_f8 + 0x10;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)local_f8,local_108._M_current,local_118._M_current);
            uVar5 = local_f8._0_8_;
            local_a8 = p_Var14;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._8_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)p_Var14[2]._M_prev) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._8_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                bVar15 = true;
              }
              else {
                iVar7 = bcmp((void *)local_f8._0_8_,p_Var14[2]._M_next,local_f8._8_8_);
                bVar15 = iVar7 == 0;
              }
            }
            else {
              bVar15 = false;
            }
            if ((undefined1 *)uVar5 != local_f8 + 0x10) {
              operator_delete((void *)uVar5,local_f8._16_8_ + 1);
            }
            p_Var14 = local_a8;
            if (!bVar15) {
              FormatString<char[21]>((string *)local_f8,(char (*) [21])"Inconsistent literal");
              DebugAssertionFailed
                        ((Char *)local_f8._0_8_,"operator()",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLTokenizer.cpp"
                         ,0x3f);
              if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
                operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
              }
            }
            _Type = *(TokenType *)&p_Var14[1]._M_prev;
            if (_Type == Undefined) {
              _Type = Identifier;
            }
          }
        }
        break;
      case 0x25:
      case 0x2a:
      case 0x2f:
LAB_0024800f:
        local_118._M_current = local_118._M_current + 1;
        _Type = MathOp;
        break;
      case 0x26:
switchD_00247b5c_caseD_26:
        if (((local_a0._M_current != _Var8._M_current ||
              (((_List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                 *)&local_110->_M_next)->_M_impl)._M_node.super__List_node_base._M_next == local_110
             ) || (p_Var14 = local_110->_M_prev, *(byte *)&(p_Var14[1]._M_prev)->_M_next != bVar2))
           || (p_Var14[2]._M_next != (_List_node_base *)0x1)) goto switchD_00247b82_caseD_7e;
        *(undefined4 *)&p_Var14[1]._M_next = 0x146;
        std::__cxx11::string::replace
                  ((ulong)&p_Var14[1]._M_prev,1,(char *)0x0,(ulong)_Var8._M_current);
LAB_0024828f:
        local_118._M_current = local_118._M_current + 1;
        goto LAB_002480b0;
      case 0x28:
        local_118._M_current = _Var8._M_current + 1;
        _Type = OpenParen;
        break;
      case 0x29:
        local_118._M_current = _Var8._M_current + 1;
        _Type = ClosingParen;
        break;
      case 0x2b:
      case 0x2d:
        if (local_110->_M_next != local_110) {
          p_Var14 = local_110->_M_prev;
          if (((local_a0._M_current == _Var8._M_current) &&
              (*(byte *)&(p_Var14[1]._M_prev)->_M_next == bVar2)) &&
             (p_Var14[2]._M_next == (_List_node_base *)0x1)) {
            *(undefined4 *)&p_Var14[1]._M_next = 0x148;
            std::__cxx11::string::replace
                      ((ulong)&p_Var14[1]._M_prev,1,(char *)0x0,(ulong)_Var8._M_current);
            goto LAB_0024828f;
          }
          uVar6 = *(int *)&p_Var14[1]._M_next - 0x136;
          if ((uVar6 < 7) && ((0x65U >> (uVar6 & 0x1f) & 1) != 0)) goto LAB_0024800f;
        }
        _Var10 = SkipFloatNumber<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                           (&local_118,&local_100);
        if (local_118._M_current == _Var10._M_current) goto LAB_0024800f;
        _Type = NumericConstant;
        local_118 = _Var10;
        break;
      case 0x2c:
        local_118._M_current = _Var8._M_current + 1;
        _Type = Comma;
        break;
      case 0x3a:
        if (((_Var8._M_current == local_a0._M_current && local_110->_M_next != local_110) &&
            (p_Var14 = local_110->_M_prev, *(char *)&(p_Var14[1]._M_prev)->_M_next == ':')) &&
           (p_Var14[2]._M_next == (_List_node_base *)0x1)) {
          *(undefined4 *)&p_Var14[1]._M_next = 0x141;
          std::__cxx11::string::replace
                    ((ulong)&p_Var14[1]._M_prev,1,(char *)0x0,(ulong)_Var8._M_current);
          goto LAB_0024828f;
        }
        _Type = Colon;
        local_118._M_current = _Var8._M_current + 1;
        break;
      case 0x3b:
        _Type = Semicolon;
        local_118._M_current = _Var8._M_current + 1;
        break;
      case 0x3c:
      case 0x3e:
        if (((local_a0._M_current == _Var8._M_current && local_110->_M_next != local_110) &&
            (p_Var14 = local_110->_M_prev, *(byte *)&(p_Var14[1]._M_prev)->_M_next == bVar2)) &&
           (p_Var14[2]._M_next == (_List_node_base *)0x1)) {
          *(undefined4 *)&p_Var14[1]._M_next = 0x147;
          std::__cxx11::string::replace
                    ((ulong)&p_Var14[1]._M_prev,1,(char *)0x0,(ulong)_Var8._M_current);
          goto LAB_0024828f;
        }
        _Type = ComparisonOp;
        local_118._M_current = _Var8._M_current + 1;
        break;
      case 0x3d:
        if (local_a0._M_current == _Var8._M_current && local_110->_M_next != local_110) {
          local_a8 = local_110->_M_prev;
          pp_Var1 = &local_a8[1]._M_prev;
          lVar13 = 0;
          do {
            iVar7 = std::__cxx11::string::compare((char *)pp_Var1);
            if (iVar7 == 0) {
              *(undefined4 *)&local_a8[1]._M_next = 0x144;
              std::__cxx11::string::replace
                        ((ulong)pp_Var1,(ulong)local_a8[2]._M_next,(char *)0x0,
                         (ulong)local_118._M_current);
              goto LAB_0024828f;
            }
            lVar13 = lVar13 + 8;
          } while (lVar13 != 0x50);
          lVar13 = 0;
          do {
            iVar7 = std::__cxx11::string::compare((char *)pp_Var1);
            if (iVar7 == 0) {
              *(undefined4 *)&local_a8[1]._M_next = 0x145;
              std::__cxx11::string::replace
                        ((ulong)pp_Var1,(ulong)local_a8[2]._M_next,(char *)0x0,
                         (ulong)local_118._M_current);
              goto LAB_0024828f;
            }
            lVar13 = lVar13 + 8;
          } while (lVar13 != 0x20);
        }
        _Type = Assignment;
        local_118._M_current = local_118._M_current + 1;
        break;
      case 0x3f:
        _Type = QuestionMark;
        local_118._M_current = _Var8._M_current + 1;
        break;
      default:
        if (bVar2 != 0x5b) goto switchD_00247b5c_caseD_24;
        _Type = OpenSquareBracket;
        local_118._M_current = _Var8._M_current + 1;
      }
LAB_00248014:
      if (cVar12._M_current == local_a0._M_current) {
        local_90._M_current = local_118._M_current;
      }
      HLSLTokenInfo::Create
                ((HLSLTokenInfo *)local_f8,_Type,&local_a0,&local_68,&local_108,&local_90,local_98);
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      _M_insert<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_110,(iterator)local_110,(HLSLTokenInfo *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_p != &local_c0) {
        operator_delete(local_d0._M_p,
                        CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._8_8_ != &local_e0) {
        operator_delete((void *)local_f8._8_8_,
                        CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1)
        ;
      }
      local_98 = local_98 + 1;
LAB_002480b0:
      if (local_118._M_current == local_100._M_current) {
        return (TokenListType *)local_110;
      }
      if (_Var8._M_current == local_118._M_current) {
        FormatString<char[46]>
                  ((string *)local_f8,(char (*) [46])"Position has not been updated by the handler."
                  );
        DebugAssertionFailed
                  ((Char *)local_f8._0_8_,"SplitString",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                   ,0x1e8);
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
        }
      }
    } while (local_118._M_current != local_100._M_current);
  }
  return (TokenListType *)local_110;
}

Assistant:

HLSLTokenizer::TokenListType HLSLTokenizer::Tokenize(const String& Source) const
{
    try
    {
        size_t TokenIdx = 0;
        return Parsing::Tokenize<HLSLTokenInfo, TokenListType>(
            Source.begin(), Source.end(),
            [&TokenIdx](HLSLTokenType                      Type,
                        const std::string::const_iterator& DelimStart,
                        const std::string::const_iterator& DelimEnd,
                        const std::string::const_iterator& LiteralStart,
                        const std::string::const_iterator& LiteralEnd) //
            {
                return HLSLTokenInfo::Create(Type, DelimStart, DelimEnd, LiteralStart, LiteralEnd, TokenIdx++);
            },
            [&](const std::string::const_iterator& Start, const std::string::const_iterator& End) //
            {
                auto KeywordIt = m_Keywords.find(HashMapStringKey{std::string{Start, End}});
                if (KeywordIt != m_Keywords.end())
                {
                    VERIFY(std::string(Start, End) == KeywordIt->second.Literal, "Inconsistent literal");
                    return KeywordIt->second.Type;
                }
                return HLSLTokenType::Identifier;
            });
    }
    catch (...)
    {
        return {};
    }
}